

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O1

_Bool trans_flw(DisasContext_conflict12 *ctx,arg_flw *a)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 a2;
  TCGOpcode opc;
  uintptr_t o_1;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == ret) goto LAB_00c7ad39;
    a2 = s->cpu_gpr[a->rs1] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)a1,(TCGArg)a2);
LAB_00c7ad39:
  if ((ctx->mstatus_fs == 0) || ((ctx->misa & 0x20) == 0)) {
    _Var1 = false;
  }
  else {
    tcg_gen_addi_i64_riscv64(s,ret,ret,(long)a->imm);
    tcg_gen_qemu_ld_i64_riscv64(s,s->cpu_fpr[a->rd],ret,(ulong)ctx->mem_idx,MO_32);
    tcg_gen_ori_i64_riscv64(s,s->cpu_fpr[a->rd],s->cpu_fpr[a->rd],-0x100000000);
    tcg_temp_free_internal_riscv64(s,(TCGTemp *)(ret + (long)s));
    mark_fs_dirty(ctx);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool trans_flw(DisasContext *ctx, arg_flw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    tcg_gen_addi_tl(tcg_ctx, t0, t0, a->imm);

    tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0, ctx->mem_idx, MO_TEUL);
    /* RISC-V requires NaN-boxing of narrower width floating point values */
    tcg_gen_ori_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rd], 0xffffffff00000000ULL);

    tcg_temp_free(tcg_ctx, t0);
    mark_fs_dirty(ctx);
    return true;
}